

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O2

void baryonyx::itm::
     random_epsilon_unique<long_double,__gnu_cxx::__normal_iterator<std::pair<long_double,int>*,std::vector<std::pair<long_double,int>,std::allocator<std::pair<long_double,int>>>>>
               (__normal_iterator<std::pair<long_double,_int>_*,_std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>_>
                begin,__normal_iterator<std::pair<long_double,_int>_*,_std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>_>
                      end,random_engine *rng,longdouble min,longdouble max)

{
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble lVar1;
  longdouble lVar2;
  uniform_real_distribution<long_double> local_48;
  
  if ((min == max) && (!NAN(min) && !NAN(max))) {
    details::fail_fast("Precondition","min != max",
                       "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/itm-common.hpp"
                       ,"954");
  }
  local_48._M_param._M_a = min;
  local_48._M_param._M_b = max;
  lVar1 = in_ST5;
  for (; begin._M_current != end._M_current; begin._M_current = begin._M_current + 1) {
    lVar2 = lVar1;
    std::uniform_real_distribution<long_double>::operator()(&local_48,rng);
    (begin._M_current)->first = in_ST0;
    in_ST0 = in_ST1;
    in_ST1 = in_ST2;
    in_ST2 = in_ST3;
    in_ST3 = in_ST4;
    in_ST4 = in_ST5;
    in_ST5 = lVar1;
    lVar1 = lVar2;
  }
  return;
}

Assistant:

inline void
random_epsilon_unique(iteratorT begin,
                      iteratorT end,
                      random_engine& rng,
                      floatingpointT min,
                      floatingpointT max)
{
    bx_expects(min != max);

    std::uniform_real_distribution<floatingpointT> distribution(min, max);

    for (; begin != end; ++begin)
        begin->first = distribution(rng);
}